

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

size_t duckdb_je_xallocx(void *ptr,size_t size,size_t extra,int flags)

{
  rtree_ctx_cache_elm_t *prVar1;
  undefined8 *puVar2;
  uint64_t uVar3;
  rtree_leaf_elm_t *prVar4;
  _Bool _Var5;
  tsd_t *tsd;
  ulong uVar6;
  rtree_leaf_elm_t *prVar7;
  rtree_ctx_t *prVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_cache_elm_t *prVar10;
  _Bool _Var11;
  ulong uVar13;
  uintptr_t new_usize;
  uint uVar14;
  rtree_leaf_elm_t *prVar15;
  bool bVar16;
  ulong local_1d8;
  rtree_ctx_t rtree_ctx_fallback;
  byte bVar12;
  
  _Var5 = duckdb_je_opt_zero;
  local_1d8 = 1;
  bVar12 = (byte)((flags & 0x40U) >> 6);
  _Var11 = (_Bool)(bVar12 | duckdb_je_opt_zero);
  tsd = (tsd_t *)__tls_get_addr(&PTR_024e2ad0);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  if (tsd == (tsd_t *)0x0) {
    prVar8 = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(prVar8);
  }
  else {
    prVar8 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar14 = (uint)((ulong)ptr >> 0x1e) & 0xf;
  prVar15 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar6 = (ulong)(uVar14 << 4);
  puVar2 = (undefined8 *)((long)&prVar8->cache[0].leafkey + uVar6);
  prVar7 = *(rtree_leaf_elm_t **)((long)&prVar8->cache[0].leafkey + uVar6);
  if (prVar7 != prVar15) {
    if ((rtree_leaf_elm_t *)prVar8->l2_cache[0].leafkey == prVar15) {
      prVar4 = prVar8->l2_cache[0].leaf;
      prVar8->l2_cache[0].leafkey = (uintptr_t)prVar7;
      prVar8->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = prVar15;
      puVar2[1] = prVar4;
    }
    else {
      prVar9 = prVar8->l2_cache + 1;
      prVar10 = prVar9;
      uVar6 = local_1d8;
      if ((rtree_leaf_elm_t *)prVar8->l2_cache[1].leafkey == prVar15) {
        local_1d8 = 0;
        bVar16 = false;
      }
      else {
        do {
          local_1d8 = uVar6;
          bVar16 = 6 < local_1d8;
          if (local_1d8 == 7) goto LAB_00cffcc8;
          prVar9 = prVar10 + 1;
          prVar1 = prVar10 + 1;
          prVar10 = prVar9;
          uVar6 = local_1d8 + 1;
        } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar15);
        bVar16 = 6 < local_1d8;
      }
      prVar4 = prVar9->leaf;
      prVar9->leafkey = prVar8->l2_cache[local_1d8].leafkey;
      prVar9->leaf = prVar8->l2_cache[local_1d8].leaf;
      prVar8->l2_cache[local_1d8].leafkey = (uintptr_t)prVar7;
      prVar8->l2_cache[local_1d8].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = prVar15;
      puVar2[1] = prVar4;
LAB_00cffcc8:
      if (bVar16) {
        duckdb_je_rtree_leaf_elm_lookup_hard
                  ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar8,(uintptr_t)ptr,true,false
                  );
      }
    }
  }
  if (tsd == (tsd_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rtree_ctx_fallback);
    prVar8 = &rtree_ctx_fallback;
  }
  else {
    prVar8 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar6 = (ulong)(uVar14 << 4);
  puVar2 = (undefined8 *)((long)&prVar8->cache[0].leafkey + uVar6);
  prVar7 = *(rtree_leaf_elm_t **)((long)&prVar8->cache[0].leafkey + uVar6);
  if (prVar7 == prVar15) {
    prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar8->l2_cache[0].leafkey == prVar15) {
    prVar4 = prVar8->l2_cache[0].leaf;
    prVar8->l2_cache[0].leafkey = (uintptr_t)prVar7;
    prVar8->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = prVar15;
    puVar2[1] = prVar4;
    prVar7 = (rtree_leaf_elm_t *)
             ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar9 = prVar8->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar8->l2_cache[1].leafkey == prVar15) {
      uVar13 = 0;
      bVar16 = false;
    }
    else {
      uVar6 = 1;
      prVar10 = prVar9;
      do {
        uVar13 = uVar6;
        bVar16 = 6 < uVar13;
        if (uVar13 == 7) goto LAB_00cffd5b;
        prVar9 = prVar10 + 1;
        prVar1 = prVar10 + 1;
        uVar6 = uVar13 + 1;
        prVar10 = prVar9;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar15);
      bVar16 = 6 < uVar13;
    }
    prVar4 = prVar9->leaf;
    prVar9->leafkey = prVar8->l2_cache[uVar13].leafkey;
    prVar9->leaf = prVar8->l2_cache[uVar13].leaf;
    prVar8->l2_cache[uVar13].leafkey = (uintptr_t)prVar7;
    prVar8->l2_cache[uVar13].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = prVar15;
    puVar2[1] = prVar4;
    prVar7 = (rtree_leaf_elm_t *)
             ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_00cffd5b:
    if (bVar16) {
      prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar8,(uintptr_t)ptr,
                          true,false);
    }
  }
  uVar6 = duckdb_je_sz_index2size_tab[(ulong)(prVar7->le_bits).repr >> 0x30];
  new_usize = uVar6;
  if (size < 0x7000000000000001) {
    uVar13 = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
    if (0x7000000000000000 - size < extra) {
      extra = 0x7000000000000000 - size;
    }
    if ((uVar13 == 0) || ((uVar13 - 1 & (ulong)ptr) == 0)) {
      _Var11 = duckdb_je_arena_ralloc_no_move
                         ((tsdn_t *)tsd,ptr,uVar6,size,extra,_Var11,(size_t *)&rtree_ctx_fallback);
    }
    else {
      _Var11 = true;
      rtree_ctx_fallback.cache[0].leafkey = uVar6;
    }
    if (_Var11 == false) {
      new_usize = rtree_ctx_fallback.cache[0].leafkey;
    }
    if (new_usize != uVar6) {
      rtree_ctx_fallback.cache[0].leafkey = CONCAT71(rtree_ctx_fallback.cache[0].leafkey._1_7_,1);
      rtree_ctx_fallback.cache[0].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      rtree_ctx_fallback.cache[1].leafkey =
           (uintptr_t)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
      rtree_ctx_fallback.cache[1].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
      rtree_ctx_fallback.cache[2].leafkey =
           (uintptr_t)
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
      uVar3 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated =
           uVar3 + new_usize;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event -
          uVar3 <= new_usize) {
        duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
      }
      rtree_ctx_fallback.cache[0].leafkey = rtree_ctx_fallback.cache[0].leafkey & 0xffffffffffffff00
      ;
      rtree_ctx_fallback.cache[0].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      rtree_ctx_fallback.cache[1].leafkey =
           (uintptr_t)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event
      ;
      rtree_ctx_fallback.cache[1].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event
      ;
      rtree_ctx_fallback.cache[2].leafkey =
           (uintptr_t)
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
      ;
      uVar3 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar3 + uVar6;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
          uVar3 <= uVar6) {
        duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
      }
      if ((duckdb_je_opt_junk_alloc == true) &&
         ((uVar6 <= new_usize && new_usize - uVar6 != 0) && (bVar12 == 0 && !_Var5))) {
        switchD_0130b471::default((void *)((long)ptr + uVar6),0xa5,new_usize - uVar6);
      }
    }
  }
  if ((tsd->state).repr != '\0') {
    rtree_ctx_fallback.cache[1].leaf = (rtree_leaf_elm_t *)(long)flags;
    rtree_ctx_fallback.cache[0].leafkey = (uintptr_t)ptr;
    rtree_ctx_fallback.cache[0].leaf = (rtree_leaf_elm_t *)size;
    rtree_ctx_fallback.cache[1].leafkey = extra;
    duckdb_je_hook_invoke_expand
              (hook_expand_xallocx,ptr,uVar6,new_usize,new_usize,(uintptr_t *)&rtree_ctx_fallback);
  }
  return new_usize;
}

Assistant:

JEMALLOC_NOTHROW
je_xallocx(void *ptr, size_t size, size_t extra, int flags) {
	tsd_t *tsd;
	size_t usize, old_usize;
	size_t alignment = MALLOCX_ALIGN_GET(flags);
	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	LOG("core.xallocx.entry", "ptr: %p, size: %zu, extra: %zu, "
	    "flags: %d", ptr, size, extra, flags);

	assert(ptr != NULL);
	assert(size != 0);
	assert(SIZE_T_MAX - size >= extra);
	assert(malloc_initialized() || IS_INITIALIZER);
	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	/*
	 * old_edata is only for verifying that xallocx() keeps the edata_t
	 * object associated with the ptr (though the content of the edata_t
	 * object can be changed).
	 */
	edata_t *old_edata = emap_edata_lookup(tsd_tsdn(tsd),
	    &arena_emap_global, ptr);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
	    &alloc_ctx);
	assert(alloc_ctx.szind != SC_NSIZES);
	old_usize = sz_index2size(alloc_ctx.szind);
	assert(old_usize == isalloc(tsd_tsdn(tsd), ptr));
	/*
	 * The API explicitly absolves itself of protecting against (size +
	 * extra) numerical overflow, but we may need to clamp extra to avoid
	 * exceeding SC_LARGE_MAXCLASS.
	 *
	 * Ordinarily, size limit checking is handled deeper down, but here we
	 * have to check as part of (size + extra) clamping, since we need the
	 * clamped value in the above helper functions.
	 */
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		usize = old_usize;
		goto label_not_resized;
	}
	if (unlikely(SC_LARGE_MAXCLASS - size < extra)) {
		extra = SC_LARGE_MAXCLASS - size;
	}

	if (config_prof && opt_prof) {
		usize = ixallocx_prof(tsd, ptr, old_usize, size, extra,
		    alignment, zero, &alloc_ctx);
	} else {
		usize = ixallocx_helper(tsd_tsdn(tsd), ptr, old_usize, size,
		    extra, alignment, zero);
	}

	/*
	 * xallocx() should keep using the same edata_t object (though its
	 * content can be changed).
	 */
	assert(emap_edata_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr)
	    == old_edata);

	if (unlikely(usize == old_usize)) {
		goto label_not_resized;
	}
	thread_alloc_event(tsd, usize);
	thread_dalloc_event(tsd, old_usize);

	if (config_fill && unlikely(opt_junk_alloc) && usize > old_usize &&
	    !zero) {
		size_t excess_len = usize - old_usize;
		void *excess_start = (void *)((byte_t *)ptr + old_usize);
		junk_alloc_callback(excess_start, excess_len);
	}
label_not_resized:
	if (unlikely(!tsd_fast(tsd))) {
		uintptr_t args[4] = {(uintptr_t)ptr, size, extra, flags};
		hook_invoke_expand(hook_expand_xallocx, ptr, old_usize,
		    usize, (uintptr_t)usize, args);
	}

	UTRACE(ptr, size, ptr);
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.xallocx.exit", "result: %zu", usize);
	return usize;
}